

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O0

void match(lzma_lzma1_encoder *coder,uint32_t pos_state,uint32_t distance,uint32_t len)

{
  uint32_t symbol;
  uint32_t bit_count;
  uint uVar1;
  uint symbol_00;
  lzma_lzma_state lVar2;
  uint local_34;
  uint32_t dist_reduced;
  uint32_t base;
  uint32_t footer_bits;
  uint32_t dist_state;
  uint32_t dist_slot;
  uint32_t len_local;
  uint32_t distance_local;
  uint32_t pos_state_local;
  lzma_lzma1_encoder *coder_local;
  
  lVar2 = STATE_NONLIT_MATCH;
  if (coder->state < STATE_LIT_MATCH) {
    lVar2 = STATE_LIT_MATCH;
  }
  coder->state = lVar2;
  length(&coder->rc,&coder->match_len_encoder,pos_state,len,(_Bool)(coder->fast_mode & 1));
  symbol = get_dist_slot(distance);
  if (len < 6) {
    local_34 = len - 2;
  }
  else {
    local_34 = 3;
  }
  rc_bittree(&coder->rc,coder->dist_slot[local_34],6,symbol);
  if (3 < symbol) {
    bit_count = (symbol >> 1) - 1;
    uVar1 = (symbol & 1 | 2) << ((byte)bit_count & 0x1f);
    symbol_00 = distance - uVar1;
    if (symbol < 0xe) {
      rc_bittree_reverse(&coder->rc,
                         (probability *)
                         ((long)coder + (ulong)symbol * -2 + (ulong)uVar1 * 2 + 0x70fa),bit_count,
                         symbol_00);
    }
    else {
      rc_direct(&coder->rc,symbol_00 >> 4,(symbol >> 1) - 5);
      rc_bittree_reverse(&coder->rc,coder->dist_align,4,symbol_00 & 0xf);
      coder->align_price_count = coder->align_price_count + 1;
    }
  }
  coder->reps[3] = coder->reps[2];
  coder->reps[2] = coder->reps[1];
  coder->reps[1] = coder->reps[0];
  coder->reps[0] = distance;
  coder->match_price_count = coder->match_price_count + 1;
  return;
}

Assistant:

static inline void
match(lzma_lzma1_encoder *coder, const uint32_t pos_state,
		const uint32_t distance, const uint32_t len)
{
	update_match(coder->state);

	length(&coder->rc, &coder->match_len_encoder, pos_state, len,
			coder->fast_mode);

	const uint32_t dist_slot = get_dist_slot(distance);
	const uint32_t dist_state = get_dist_state(len);
	rc_bittree(&coder->rc, coder->dist_slot[dist_state],
			DIST_SLOT_BITS, dist_slot);

	if (dist_slot >= DIST_MODEL_START) {
		const uint32_t footer_bits = (dist_slot >> 1) - 1;
		const uint32_t base = (2 | (dist_slot & 1)) << footer_bits;
		const uint32_t dist_reduced = distance - base;

		if (dist_slot < DIST_MODEL_END) {
			// Careful here: base - dist_slot - 1 can be -1, but
			// rc_bittree_reverse starts at probs[1], not probs[0].
			rc_bittree_reverse(&coder->rc,
				coder->dist_special + base - dist_slot - 1,
				footer_bits, dist_reduced);
		} else {
			rc_direct(&coder->rc, dist_reduced >> ALIGN_BITS,
					footer_bits - ALIGN_BITS);
			rc_bittree_reverse(
					&coder->rc, coder->dist_align,
					ALIGN_BITS, dist_reduced & ALIGN_MASK);
			++coder->align_price_count;
		}
	}

	coder->reps[3] = coder->reps[2];
	coder->reps[2] = coder->reps[1];
	coder->reps[1] = coder->reps[0];
	coder->reps[0] = distance;
	++coder->match_price_count;
}